

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

pair<std::complex<double>,_std::complex<double>_> *
Utils::SolveQuadratic
          (pair<std::complex<double>,_std::complex<double>_> *__return_storage_ptr__,double a,
          double b,double c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double local_b0;
  complex<double> local_a8;
  complex<double> local_98;
  complex<double> local_88;
  double local_78;
  complex<double> local_70;
  complex<double> local_60;
  complex<double> local_50;
  complex<double> local_40;
  undefined1 local_30 [8];
  Complex D;
  double c_local;
  double b_local;
  double a_local;
  
  uVar2 = 0;
  D._M_value._8_8_ = c;
  std::complex<double>::complex(&local_40,b * b + -(a * 4.0 * c),0.0);
  std::sqrt<double>(&local_40);
  uVar1 = 0;
  D._M_value._0_8_ = uVar2;
  std::complex<double>::complex(&local_70,-b,0.0);
  std::operator+(&local_70,(complex<double> *)local_30);
  local_78 = a * 2.0;
  local_60._M_value._8_8_ = uVar1;
  std::operator/(&local_60,&local_78);
  uVar2 = 0;
  local_50._M_value._8_8_ = uVar1;
  std::complex<double>::complex(&local_a8,-b,0.0);
  std::operator-(&local_a8,(complex<double> *)local_30);
  local_b0 = a * 2.0;
  local_98._M_value._8_8_ = uVar2;
  std::operator/(&local_98,&local_b0);
  local_88._M_value._8_8_ = uVar2;
  std::pair<std::complex<double>,_std::complex<double>_>::
  pair<std::complex<double>,_std::complex<double>,_true>(__return_storage_ptr__,&local_50,&local_88)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Complex, Complex> Utils::SolveQuadratic(double a, double b, double c)
{
    Complex D = std::sqrt(Complex(b * b - 4 * a * c));
    return {(Complex(-b) + D) / (2 * a), (Complex(-b) - D) / (2 * a)};
}